

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_variable_elimination.h
# Opt level: O2

void __thiscall
spvtools::opt::DeadVariableElimination::DeadVariableElimination(DeadVariableElimination *this)

{
  MemPass::MemPass(&this->super_MemPass);
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)&PTR__DeadVariableElimination_008aef88
  ;
  (this->reference_count_)._M_h._M_buckets = &(this->reference_count_)._M_h._M_single_bucket;
  (this->reference_count_)._M_h._M_bucket_count = 1;
  (this->reference_count_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->reference_count_)._M_h._M_element_count = 0;
  (this->reference_count_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->reference_count_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->reference_count_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

const char* name() const override { return "eliminate-dead-variables"; }